

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

uint __thiscall crnlib::symbol_codec::decode_rice(symbol_codec *this,uint m)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint q;
  int iVar6;
  bool bVar7;
  
  iVar6 = 0;
  do {
    uVar4 = decode_peek_bits(this,0x10);
    uVar5 = ~uVar4 & 0xffff;
    bVar7 = uVar5 < 0x100;
    uVar1 = uVar5 >> 8;
    if (bVar7) {
      uVar1 = uVar5;
    }
    iVar2 = (uint)bVar7 * 8 + 4;
    uVar5 = uVar1 >> 4;
    if (uVar1 < 0x10) {
      iVar2 = (uint)bVar7 * 8 + 8;
      uVar5 = uVar1;
    }
    iVar3 = iVar2 + -2;
    uVar1 = uVar5 >> 2;
    if (uVar5 < 4) {
      iVar3 = iVar2;
      uVar1 = uVar5;
    }
    uVar4 = (iVar3 - (uint)(1 < uVar1)) - (uint)((uVar1 >> (uint)(1 < uVar1) & 1) != 0);
    iVar6 = iVar6 + uVar4;
    decode_remove_bits(this,uVar4);
  } while (0xf < uVar4);
  remove_bits(this,1);
  uVar4 = decode_bits(this,m);
  return uVar4 + (iVar6 << ((byte)m & 0x1f));
}

Assistant:

uint symbol_codec::decode_rice(uint m) {
  CRNLIB_ASSERT(m > 0);

  uint q = 0;

  for (;;) {
    uint k = decode_peek_bits(16);

    uint l = utils::count_leading_zeros16((~k) & 0xFFFF);

    q += l;

    decode_remove_bits(l);

    if (l < 16)
      break;
  }

  decode_remove_bits(1);

  uint r = decode_bits(m);

  return (q << m) + r;
}